

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_3_3::staticInitialize(void)

{
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffe8;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if ((staticInitialize::initialized & 1U) == 0) {
    TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<float>_>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>::registerAttributeType();
    TypedAttribute<Imf_3_3::ChannelList>::registerAttributeType();
    TypedAttribute<Imf_3_3::Compression>::registerAttributeType();
    TypedAttribute<Imf_3_3::Chromaticities>::registerAttributeType();
    TypedAttribute<Imf_3_3::DeepImageState>::registerAttributeType();
    TypedAttribute<double>::registerAttributeType();
    TypedAttribute<Imf_3_3::Envmap>::registerAttributeType();
    TypedAttribute<float>::registerAttributeType();
    TypedAttribute<std::vector<float,_std::allocator<float>_>_>::registerAttributeType();
    TypedAttribute<int>::registerAttributeType();
    TypedAttribute<Imf_3_3::KeyCode>::registerAttributeType();
    TypedAttribute<Imf_3_3::LineOrder>::registerAttributeType();
    TypedAttribute<Imath_3_1::Matrix33<double>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Matrix33<float>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Matrix44<double>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Matrix44<float>_>::registerAttributeType();
    TypedAttribute<Imf_3_3::PreviewImage>::registerAttributeType();
    TypedAttribute<Imf_3_3::Rational>::registerAttributeType();
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::registerAttributeType();
    TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::registerAttributeType();
    TypedAttribute<Imf_3_3::TileDescription>::registerAttributeType();
    TypedAttribute<Imf_3_3::TimeCode>::registerAttributeType();
    TypedAttribute<Imath_3_1::Vec2<double>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Vec2<float>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Vec2<int>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Vec3<double>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Vec3<float>_>::registerAttributeType();
    TypedAttribute<Imath_3_1::Vec3<int>_>::registerAttributeType();
    TypedAttribute<Imf_3_3::CompressedIDManifest>::registerAttributeType();
    staticInitialize::initialized = true;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x162b51);
  return;
}

Assistant:

void
staticInitialize ()
{
#if ILMTHREAD_THREADING_ENABLED
    static std::mutex           criticalSection;
    std::lock_guard<std::mutex> lock (criticalSection);
#endif
    static bool initialized = false;

    if (!initialized)
    {
        //
        // One-time initialization -- register
        // some predefined attribute types.
        //

        Box2fAttribute::registerAttributeType ();
        Box2iAttribute::registerAttributeType ();
        ChannelListAttribute::registerAttributeType ();
        CompressionAttribute::registerAttributeType ();
        ChromaticitiesAttribute::registerAttributeType ();
        DeepImageStateAttribute::registerAttributeType ();
        DoubleAttribute::registerAttributeType ();
        EnvmapAttribute::registerAttributeType ();
        FloatAttribute::registerAttributeType ();
        FloatVectorAttribute::registerAttributeType ();
        IntAttribute::registerAttributeType ();
        KeyCodeAttribute::registerAttributeType ();
        LineOrderAttribute::registerAttributeType ();
        M33dAttribute::registerAttributeType ();
        M33fAttribute::registerAttributeType ();
        M44dAttribute::registerAttributeType ();
        M44fAttribute::registerAttributeType ();
        PreviewImageAttribute::registerAttributeType ();
        RationalAttribute::registerAttributeType ();
        StringAttribute::registerAttributeType ();
        StringVectorAttribute::registerAttributeType ();
        TileDescriptionAttribute::registerAttributeType ();
        TimeCodeAttribute::registerAttributeType ();
        V2dAttribute::registerAttributeType ();
        V2fAttribute::registerAttributeType ();
        V2iAttribute::registerAttributeType ();
        V3dAttribute::registerAttributeType ();
        V3fAttribute::registerAttributeType ();
        V3iAttribute::registerAttributeType ();
        IDManifestAttribute::registerAttributeType ();

        //
        // Register functions, for example specialized functions
        // for different CPU architectures.
        //

        initialized = true;
    }
}